

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_avx2.c
# Opt level: O0

void aom_quantize_b_32x32_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  __m256i eob256;
  __m256i coeff_vals;
  __m256i coeff_vals_00;
  __m256i v_mask;
  __m256i coeff_vals_01;
  __m256i coeff_vals_02;
  __m256i v_mask_00;
  __m256i v_eobmax_00;
  __m256i v_eobmax_01;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  int16_t iVar3;
  __m256i *in_RCX;
  int16_t *in_RDX;
  longlong *in_RSI;
  int16_t *in_RDI;
  tran_low_t *in_R8;
  __m256i *in_R9;
  undefined8 uVar4;
  undefined1 auVar5 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar6 [64];
  undefined8 *in_stack_00000008;
  intptr_t count;
  __m256i v_nz_mask;
  __m256i v_eobmax;
  __m256i v_quant_shift;
  __m256i v_dequant;
  __m256i v_quant;
  __m256i v_round;
  __m256i v_zbin;
  __m256i v_nz_mask_2;
  __m256i v_qcoeff_1;
  __m256i v_dqcoeff_1;
  __m256i v_dqcoeff_lo_1;
  __m256i v_dqcoeff_hi_1;
  __m256i v_tmp32_1;
  __m256i v_tmp32_lo_1;
  __m256i v_tmp32_hi_1;
  __m256i v_tmp32_b_1;
  __m256i v_tmp32_a_1;
  __m256i v_tmp_rnd_1;
  __m256i v_zbin_mask_1;
  __m256i v_abs_coeff_1;
  __m256i v_coeff_1;
  __m256i v_nz_mask_1;
  __m256i v_qcoeff;
  __m256i v_dqcoeff;
  __m256i v_dqcoeff_lo;
  __m256i v_dqcoeff_hi;
  __m256i v_tmp32;
  __m256i v_tmp32_lo;
  __m256i v_tmp32_hi;
  __m256i v_tmp32_b;
  __m256i v_tmp32_a;
  __m256i v_tmp_rnd;
  __m256i v_zbin_mask;
  __m256i v_abs_coeff;
  __m256i v_coeff;
  undefined4 in_stack_ffffffffffffeb44;
  int in_stack_ffffffffffffeb48;
  undefined8 in_stack_ffffffffffffeb58;
  undefined1 (*coeff_ptr_00) [32];
  undefined1 (*dequant_ptr_00) [32];
  undefined1 (*pauVar10) [32];
  undefined8 in_stack_ffffffffffffebb8;
  longlong *plVar11;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1408;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  uint local_135c;
  int16_t *local_1358;
  int16_t *local_1350;
  tran_low_t *local_1348;
  tran_low_t *local_1340;
  undefined8 *local_1338;
  longlong *local_1310;
  int16_t *local_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fc4;
  undefined1 (*local_fc0) [32];
  undefined1 (*local_fb8) [32];
  undefined1 (*local_fb0) [32];
  undefined1 (*local_fa8) [32];
  undefined1 (*local_fa0) [32];
  tran_low_t *local_f98;
  undefined8 *local_f90;
  int16_t *local_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  longlong lStack_f70;
  undefined8 uStack_f68;
  undefined1 local_f60 [32];
  undefined1 local_f40 [32];
  undefined1 local_f20 [32];
  undefined1 local_f00 [32];
  undefined1 local_ee0 [32];
  undefined1 local_ec0 [32];
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  ulong uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  long lStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  tran_low_t *local_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 *local_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  tran_low_t *local_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 *local_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  long lStack_c88;
  undefined1 local_c80 [32];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [32];
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  uint local_884;
  undefined1 (*local_880) [32];
  undefined1 (*local_878) [32];
  undefined1 (*local_870) [32];
  undefined1 (*local_868) [32];
  undefined1 (*local_860) [32];
  tran_low_t *local_858;
  undefined8 *local_850;
  int16_t *local_848;
  undefined8 local_840;
  undefined8 uStack_838;
  longlong lStack_830;
  undefined8 uStack_828;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  ulong uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  long lStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  tran_low_t *local_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 *local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  tran_low_t *local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  long lStack_548;
  undefined1 local_540 [32];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  uint local_304;
  undefined1 local_300 [32];
  uint local_2c4;
  undefined1 local_2c0 [32];
  uint local_284;
  undefined1 local_280 [32];
  uint local_244;
  undefined1 local_240 [32];
  uint local_204;
  undefined1 local_200 [32];
  uint local_1c4;
  undefined1 local_1c0 [32];
  uint local_184;
  undefined1 local_180 [32];
  uint local_144;
  undefined1 local_140 [32];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  
  local_1338 = in_stack_00000008;
  local_1340 = qcoeff_ptr;
  local_1348 = dqcoeff_ptr;
  local_1350 = dequant_ptr;
  local_1358 = scan;
  local_135c = 1;
  local_1300 = 0;
  uStack_12f8 = 0;
  uStack_12f0 = 0;
  uStack_12e8 = 0;
  uVar4 = 0;
  uVar7 = 0;
  dequant_ptr_00 = &local_13e0;
  pauVar10 = &local_13a0;
  coeff_ptr_00 = &local_13c0;
  uVar8 = 0;
  uVar9 = 0;
  local_1310 = in_RSI;
  local_1308 = in_RDI;
  load_b_values_avx2(in_RDI,(__m256i *)in_RSI,in_RDX,in_RCX,(int16_t *)in_R8,in_R9,
                     (int16_t *)dequant_ptr_00,in_R9,(int16_t *)local_1400,
                     (__m256i *)CONCAT44(in_stack_ffffffffffffeb44,1),in_stack_ffffffffffffeb48);
  local_848 = local_1308;
  local_850 = local_1338;
  local_858 = local_1340;
  local_884 = local_135c;
  local_880 = &local_1400;
  local_878 = &local_1380;
  local_870 = pauVar10;
  local_868 = dequant_ptr_00;
  local_860 = coeff_ptr_00;
  load_coefficients_avx2((tran_low_t *)coeff_ptr_00);
  auVar5._8_8_ = uVar7;
  auVar5._0_8_ = uVar4;
  auVar5._16_8_ = uVar8;
  auVar5._24_8_ = uVar9;
  local_8e0 = vpabsw_avx2(auVar5);
  local_6c0 = *(undefined8 *)*local_878;
  uStack_6b8 = *(undefined8 *)(*local_878 + 8);
  uStack_6b0 = *(undefined8 *)(*local_878 + 0x10);
  uStack_6a8 = *(undefined8 *)(*local_878 + 0x18);
  local_6a0 = local_8e0._0_8_;
  uStack_698 = local_8e0._8_8_;
  uStack_690 = local_8e0._16_8_;
  uStack_688 = local_8e0._24_8_;
  local_900 = vpcmpgtw_avx2(local_8e0,*local_878);
  local_680 = local_900._0_8_;
  uStack_678 = local_900._8_8_;
  uStack_670 = local_900._16_8_;
  lStack_668 = local_900._24_8_;
  local_8c0 = uVar4;
  uStack_8b8 = uVar7;
  uStack_8b0 = uVar8;
  uStack_8a8 = uVar9;
  local_720 = uVar4;
  uStack_718 = uVar7;
  uStack_710 = uVar8;
  uStack_708 = uVar9;
  if ((((((((((((((((((((((((((((((((local_900 >> 7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (local_900 >> 0xf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_900 >> 0x17 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                                 (local_900 >> 0x1f & (undefined1  [32])0x1) ==
                                 (undefined1  [32])0x0) &&
                                (local_900 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (local_900 >> 0x2f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (local_900 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_900 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_900 >> 0x47 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                           (local_900 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_900 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (local_900 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_900 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (local_900 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_900 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_900 >> 0x7f,0) == '\0') &&
                    (local_900 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_900 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_900 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (local_900 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_900 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (local_900 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_900 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_900 >> 0xbf,0) == '\0') &&
            (local_900 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (local_900 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (local_900 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (local_900 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (local_900 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (local_900 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (local_900 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      -1 < (long)local_900._24_8_) {
    local_7a0 = ZEXT832(0) << 0x20;
    local_780._8_8_ = SUB328(ZEXT832(0),4);
    local_568 = local_850;
    local_5a0 = 0;
    uStack_598 = local_780._8_8_;
    uStack_590 = 0;
    uStack_588 = 0;
    *local_850 = 0;
    local_850[1] = local_780._8_8_;
    local_850[2] = 0;
    local_850[3] = 0;
    local_5a8 = local_858;
    local_5e0 = 0;
    uStack_5d8 = local_780._8_8_;
    uStack_5d0 = 0;
    uStack_5c8 = 0;
    local_858[0] = 0;
    local_858[1] = 0;
    *(undefined8 *)(local_858 + 2) = local_780._8_8_;
    local_858[4] = 0;
    local_858[5] = 0;
    local_858[6] = 0;
    local_858[7] = 0;
    local_5e8 = local_850 + 4;
    local_800 = ZEXT832(0) << 0x20;
    local_7c0._8_8_ = SUB328(ZEXT832(0),4);
    local_620 = 0;
    uStack_618 = local_7c0._8_8_;
    uStack_610 = 0;
    uStack_608 = 0;
    *local_5e8 = 0;
    local_850[5] = local_7c0._8_8_;
    local_850[6] = 0;
    local_850[7] = 0;
    local_628 = local_858 + 8;
    local_660 = 0;
    uStack_658 = local_7c0._8_8_;
    uStack_650 = 0;
    uStack_648 = 0;
    local_628[0] = 0;
    local_628[1] = 0;
    *(undefined8 *)(local_858 + 10) = local_7c0._8_8_;
    local_858[0xc] = 0;
    local_858[0xd] = 0;
    local_858[0xe] = 0;
    local_858[0xf] = 0;
    local_840 = 0;
    uStack_838 = local_7c0._8_8_;
    lStack_830 = 0;
    uStack_828 = 0;
    local_7e0 = local_800;
    local_7c0 = local_800;
    local_780 = local_7a0;
  }
  else {
    local_520 = *(undefined8 *)*local_870;
    uStack_518 = *(undefined8 *)(*local_870 + 8);
    uStack_510 = *(undefined8 *)(*local_870 + 0x10);
    uStack_508 = *(undefined8 *)(*local_870 + 0x18);
    local_500 = local_8e0._0_8_;
    uStack_4f8 = local_8e0._8_8_;
    uStack_4f0 = local_8e0._16_8_;
    uStack_4e8 = local_8e0._24_8_;
    local_540 = vpaddsw_avx2(local_8e0,*local_870);
    local_560 = local_900._0_8_;
    uStack_558 = local_900._8_8_;
    uStack_550 = local_900._16_8_;
    lStack_548 = local_900._24_8_;
    local_920 = vpand_avx2(local_540,local_900);
    local_460 = *(undefined8 *)*local_860;
    uStack_458 = *(undefined8 *)(*local_860 + 8);
    uStack_450 = *(undefined8 *)(*local_860 + 0x10);
    uStack_448 = *(undefined8 *)(*local_860 + 0x18);
    local_440 = local_920._0_8_;
    uStack_438 = local_920._8_8_;
    uStack_430 = local_920._16_8_;
    uStack_428 = local_920._24_8_;
    local_940 = vpmulhw_avx2(local_920,*local_860);
    local_740 = local_940._0_8_;
    uStack_738 = local_940._8_8_;
    uStack_730 = local_940._16_8_;
    uStack_728 = local_940._24_8_;
    local_760 = local_920._0_8_;
    uStack_758 = local_920._8_8_;
    uStack_750 = local_920._16_8_;
    uStack_748 = local_920._24_8_;
    local_960 = vpaddw_avx2(local_940,local_920);
    local_4a0 = *(undefined8 *)*local_880;
    uStack_498 = *(undefined8 *)((long)*local_880 + 8);
    uStack_490 = *(undefined8 *)((long)*local_880 + 0x10);
    uStack_488 = *(undefined8 *)((long)*local_880 + 0x18);
    local_480 = local_960._0_8_;
    uStack_478 = local_960._8_8_;
    uStack_470 = local_960._16_8_;
    uStack_468 = local_960._24_8_;
    local_2c0 = vpmulhw_avx2(local_960,*local_880);
    local_2c4 = local_884;
    local_980 = vpsllw_avx2(local_2c0,ZEXT416(local_884));
    local_360 = *(undefined8 *)*local_880;
    uStack_358 = *(undefined8 *)((long)*local_880 + 8);
    uStack_350 = *(undefined8 *)((long)*local_880 + 0x10);
    uStack_348 = *(undefined8 *)((long)*local_880 + 0x18);
    local_340 = local_960._0_8_;
    uStack_338 = local_960._8_8_;
    uStack_330 = local_960._16_8_;
    uStack_328 = local_960._24_8_;
    local_1c0 = vpmullw_avx2(local_960,*local_880);
    local_1c4 = 0x10 - local_884;
    local_9a0 = vpsrlw_avx2(local_1c0,ZEXT416(local_1c4));
    local_c0 = local_980._0_8_;
    uStack_b8 = local_980._8_8_;
    uStack_b0 = local_980._16_8_;
    uStack_a8 = local_980._24_8_;
    local_e0 = local_9a0._0_8_;
    uStack_d8 = local_9a0._8_8_;
    uStack_d0 = local_9a0._16_8_;
    uStack_c8 = local_9a0._24_8_;
    local_9c0 = vpor_avx2(local_980,local_9a0);
    local_4e0 = *(undefined8 *)*local_868;
    uStack_4d8 = *(undefined8 *)((long)*local_868 + 8);
    uStack_4d0 = *(undefined8 *)((long)*local_868 + 0x10);
    uStack_4c8 = *(undefined8 *)((long)*local_868 + 0x18);
    local_4c0 = local_9c0._0_8_;
    uStack_4b8 = local_9c0._8_8_;
    uStack_4b0 = local_9c0._16_8_;
    uStack_4a8 = local_9c0._24_8_;
    local_300 = vpmulhw_avx2(local_9c0,*local_868);
    local_304 = 0x10 - local_884;
    local_9e0 = vpsllw_avx2(local_300,ZEXT416(local_304));
    local_3a0 = *(undefined8 *)*local_868;
    uStack_398 = *(undefined8 *)((long)*local_868 + 8);
    uStack_390 = *(undefined8 *)((long)*local_868 + 0x10);
    uStack_388 = *(undefined8 *)((long)*local_868 + 0x18);
    local_380 = local_9c0._0_8_;
    uStack_378 = local_9c0._8_8_;
    uStack_370 = local_9c0._16_8_;
    uStack_368 = local_9c0._24_8_;
    local_200 = vpmullw_avx2(local_9c0,*local_868);
    local_204 = local_884;
    local_a00 = vpsrlw_avx2(local_200,ZEXT416(local_884));
    local_100 = local_9e0._0_8_;
    uStack_f8 = local_9e0._8_8_;
    uStack_f0 = local_9e0._16_8_;
    uStack_e8 = local_9e0._24_8_;
    local_120 = local_a00._0_8_;
    uStack_118 = local_a00._8_8_;
    uStack_110 = local_a00._16_8_;
    uStack_108 = local_a00._24_8_;
    local_3c0 = vpor_avx2(local_9e0,local_a00);
    auVar2._8_8_ = uVar7;
    auVar2._0_8_ = uVar4;
    auVar2._16_8_ = uVar8;
    auVar2._24_8_ = uVar9;
    local_a20 = vpsignw_avx2(local_3c0,auVar2);
    local_400 = local_9c0._0_8_;
    uStack_3f8 = local_9c0._8_8_;
    uStack_3f0 = local_9c0._16_8_;
    uStack_3e8 = local_9c0._24_8_;
    auVar1._8_8_ = uVar7;
    auVar1._0_8_ = uVar4;
    auVar1._16_8_ = uVar8;
    auVar1._24_8_ = uVar9;
    local_a40 = vpsignw_avx2(local_9c0,auVar1);
    local_820._8_8_ = SUB328(ZEXT832(0),4);
    local_6e0 = local_9c0._0_8_;
    uStack_6d8 = local_9c0._8_8_;
    uStack_6d0 = local_9c0._16_8_;
    uStack_6c8 = local_9c0._24_8_;
    local_700 = 0;
    uStack_6f8 = local_820._8_8_;
    uStack_6f0 = 0;
    uStack_6e8 = 0;
    local_a60 = vpcmpgtw_avx2(local_9c0,ZEXT832((ulong)local_820._8_8_) << 0x40);
    coeff_vals[1] = (longlong)in_RDX;
    coeff_vals[0] = (longlong)in_RCX;
    coeff_vals[2] = (longlong)in_RSI;
    coeff_vals[3] = (longlong)in_RDI;
    local_820 = ZEXT832(0) << 0x20;
    local_420 = uVar4;
    uStack_418 = uVar7;
    uStack_410 = uVar8;
    uStack_408 = uVar9;
    local_3e0 = uVar4;
    uStack_3d8 = uVar7;
    uStack_3d0 = uVar8;
    uStack_3c8 = uVar9;
    store_coefficients_avx2(coeff_vals,in_R8);
    coeff_vals_00[1] = (longlong)in_RDX;
    coeff_vals_00[0] = (longlong)in_RCX;
    coeff_vals_00[2] = (longlong)in_RSI;
    coeff_vals_00[3] = (longlong)in_RDI;
    store_coefficients_avx2(coeff_vals_00,in_R8);
    local_840 = local_a60._0_8_;
    uStack_838 = local_a60._8_8_;
    lStack_830 = local_a60._16_8_;
    uStack_828 = local_a60._24_8_;
  }
  local_1420 = 0;
  uStack_1418 = 0;
  stack0xffffffffffffebf0 = (int16_t *)0x0;
  uStack_1408 = 0;
  v_eobmax_00[1] = local_840;
  v_eobmax_00[0] = in_stack_ffffffffffffebb8;
  v_eobmax_00[2] = uStack_838;
  v_eobmax_00[3] = lStack_830;
  v_mask[1] = (longlong)in_RDX;
  v_mask[0] = (longlong)in_RCX;
  v_mask[2] = (longlong)in_RSI;
  v_mask[3] = (longlong)in_RDI;
  get_max_lane_eob((int16_t *)0x0,v_eobmax_00,v_mask);
  local_11c0 = local_13a0._0_8_;
  uStack_11b8 = local_13a0._8_8_;
  uStack_11b0 = local_13a0._16_8_;
  uStack_11a8 = local_13a0._24_8_;
  local_11e0 = local_13a0._0_8_;
  uStack_11d8 = local_13a0._8_8_;
  uStack_11d0 = local_13a0._16_8_;
  uStack_11c8 = local_13a0._24_8_;
  local_13a0 = vpunpckhqdq_avx2(local_13a0,local_13a0);
  local_1200 = local_13c0._0_8_;
  uStack_11f8 = local_13c0._8_8_;
  uStack_11f0 = local_13c0._16_8_;
  uStack_11e8 = local_13c0._24_8_;
  local_1220 = local_13c0._0_8_;
  uStack_1218 = local_13c0._8_8_;
  uStack_1210 = local_13c0._16_8_;
  uStack_1208 = local_13c0._24_8_;
  local_13c0 = vpunpckhqdq_avx2(local_13c0,local_13c0);
  local_1240 = local_13e0._0_8_;
  uStack_1238 = local_13e0._8_8_;
  uStack_1230 = local_13e0._16_8_;
  uStack_1228 = local_13e0._24_8_;
  local_1260 = local_13e0._0_8_;
  uStack_1258 = local_13e0._8_8_;
  uStack_1250 = local_13e0._16_8_;
  uStack_1248 = local_13e0._24_8_;
  local_13e0 = vpunpckhqdq_avx2(local_13e0,local_13e0);
  local_1280 = local_1400._0_8_;
  uStack_1278 = local_1400._8_8_;
  uStack_1270 = local_1400._16_8_;
  uStack_1268 = local_1400._24_8_;
  local_12a0 = local_1400._0_8_;
  uStack_1298 = local_1400._8_8_;
  uStack_1290 = local_1400._16_8_;
  uStack_1288 = local_1400._24_8_;
  local_1400 = vpunpckhqdq_avx2(local_1400,local_1400);
  local_12c0 = local_1380._0_8_;
  uStack_12b8 = local_1380._8_8_;
  uStack_12b0 = local_1380._16_8_;
  uStack_12a8 = local_1380._24_8_;
  local_12e0 = local_1380._0_8_;
  uStack_12d8 = local_1380._8_8_;
  uStack_12d0 = local_1380._16_8_;
  uStack_12c8 = local_1380._24_8_;
  local_1380 = vpunpckhqdq_avx2(local_1380,local_1380);
  auVar6 = ZEXT3264(local_1380);
  plVar11 = local_1310;
  while (plVar11 = plVar11 + -2, auVar5 = auVar6._0_32_, 0 < (long)plVar11) {
    local_1308 = local_1308 + 0x20;
    local_1338 = local_1338 + 8;
    local_1340 = local_1340 + 0x10;
    local_1358 = local_1358 + 0x10;
    local_fa0 = &local_13c0;
    local_fa8 = &local_13e0;
    local_fb0 = &local_13a0;
    local_fb8 = &local_1380;
    local_fc0 = &local_1400;
    local_fc4 = local_135c;
    local_f98 = local_1340;
    local_f90 = local_1338;
    local_f88 = local_1308;
    load_coefficients_avx2((tran_low_t *)coeff_ptr_00);
    local_1000._0_8_ = auVar5._0_8_;
    local_1000._8_8_ = auVar5._8_8_;
    local_1000._16_8_ = auVar5._16_8_;
    local_1000._24_8_ = auVar5._24_8_;
    local_e60 = local_1000._0_8_;
    uStack_e58 = local_1000._8_8_;
    uStack_e50 = local_1000._16_8_;
    uStack_e48 = local_1000._24_8_;
    local_1020 = vpabsw_avx2(auVar5);
    local_e00 = *(undefined8 *)*local_fb8;
    uStack_df8 = *(undefined8 *)(*local_fb8 + 8);
    uStack_df0 = *(undefined8 *)(*local_fb8 + 0x10);
    uStack_de8 = *(undefined8 *)(*local_fb8 + 0x18);
    local_de0 = local_1020._0_8_;
    uStack_dd8 = local_1020._8_8_;
    uStack_dd0 = local_1020._16_8_;
    uStack_dc8 = local_1020._24_8_;
    local_1040 = vpcmpgtw_avx2(local_1020,*local_fb8);
    local_dc0 = local_1040._0_8_;
    uStack_db8 = local_1040._8_8_;
    uStack_db0 = local_1040._16_8_;
    lStack_da8 = local_1040._24_8_;
    local_1000 = auVar5;
    if ((((((((((((((((((((((((((((((((local_1040 >> 7 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (local_1040 >> 0xf & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (local_1040 >> 0x17 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (local_1040 >> 0x1f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_1040 >> 0x27 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                                 (local_1040 >> 0x2f & (undefined1  [32])0x1) ==
                                 (undefined1  [32])0x0) &&
                                (local_1040 >> 0x37 & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0) &&
                               (local_1040 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (local_1040 >> 0x47 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (local_1040 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (local_1040 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                            ) && (local_1040 >> 0x5f & (undefined1  [32])0x1) ==
                                 (undefined1  [32])0x0) &&
                          (local_1040 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (local_1040 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1040 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_1040 >> 0x7f,0) == '\0') &&
                      (local_1040 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (local_1040 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1040 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_1040 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_1040 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (local_1040 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_1040 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_1040 >> 0xbf,0) == '\0') &&
              (local_1040 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (local_1040 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_1040 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (local_1040 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (local_1040 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (local_1040 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (local_1040 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        -1 < (long)local_1040._24_8_) {
      local_ee0 = ZEXT832(0) << 0x20;
      local_ec0._8_8_ = SUB328(ZEXT832(0),4);
      local_ca8 = local_f90;
      local_ce0 = 0;
      uStack_cd8 = local_ec0._8_8_;
      uStack_cd0 = 0;
      uStack_cc8 = 0;
      *local_f90 = 0;
      local_f90[1] = local_ec0._8_8_;
      local_f90[2] = 0;
      local_f90[3] = 0;
      local_ce8 = local_f98;
      local_d20 = 0;
      uStack_d18 = local_ec0._8_8_;
      uStack_d10 = 0;
      uStack_d08 = 0;
      local_f98[0] = 0;
      local_f98[1] = 0;
      *(undefined8 *)(local_f98 + 2) = local_ec0._8_8_;
      local_f98[4] = 0;
      local_f98[5] = 0;
      local_f98[6] = 0;
      local_f98[7] = 0;
      local_d28 = local_f90 + 4;
      local_f40 = ZEXT832(0) << 0x20;
      local_f00._8_8_ = SUB328(ZEXT832(0),4);
      local_d60 = 0;
      uStack_d58 = local_f00._8_8_;
      uStack_d50 = 0;
      uStack_d48 = 0;
      *local_d28 = 0;
      local_f90[5] = local_f00._8_8_;
      local_f90[6] = 0;
      local_f90[7] = 0;
      local_d68 = local_f98 + 8;
      local_da0 = 0;
      uStack_d98 = local_f00._8_8_;
      uStack_d90 = 0;
      uStack_d88 = 0;
      local_d68[0] = 0;
      local_d68[1] = 0;
      *(undefined8 *)(local_f98 + 10) = local_f00._8_8_;
      local_f98[0xc] = 0;
      local_f98[0xd] = 0;
      local_f98[0xe] = 0;
      local_f98[0xf] = 0;
      local_f80 = 0;
      uStack_f78 = local_f00._8_8_;
      lStack_f70 = 0;
      uStack_f68 = 0;
      local_f20 = local_f40;
      local_f00 = local_f40;
      local_ec0 = local_ee0;
    }
    else {
      local_c60 = *(undefined8 *)*local_fb0;
      uStack_c58 = *(undefined8 *)(*local_fb0 + 8);
      uStack_c50 = *(undefined8 *)(*local_fb0 + 0x10);
      uStack_c48 = *(undefined8 *)(*local_fb0 + 0x18);
      local_c40 = local_1020._0_8_;
      uStack_c38 = local_1020._8_8_;
      uStack_c30 = local_1020._16_8_;
      uStack_c28 = local_1020._24_8_;
      local_c80 = vpaddsw_avx2(local_1020,*local_fb0);
      local_ca0 = local_1040._0_8_;
      uStack_c98 = local_1040._8_8_;
      uStack_c90 = local_1040._16_8_;
      lStack_c88 = local_1040._24_8_;
      local_1060 = vpand_avx2(local_c80,local_1040);
      local_ba0 = *(undefined8 *)*local_fa0;
      uStack_b98 = *(undefined8 *)(*local_fa0 + 8);
      uStack_b90 = *(undefined8 *)(*local_fa0 + 0x10);
      uStack_b88 = *(undefined8 *)(*local_fa0 + 0x18);
      local_b80 = local_1060._0_8_;
      uStack_b78 = local_1060._8_8_;
      uStack_b70 = local_1060._16_8_;
      uStack_b68 = local_1060._24_8_;
      local_1080 = vpmulhw_avx2(local_1060,*local_fa0);
      local_e80 = local_1080._0_8_;
      uStack_e78 = local_1080._8_8_;
      uStack_e70 = local_1080._16_8_;
      uStack_e68 = local_1080._24_8_;
      local_ea0 = local_1060._0_8_;
      uStack_e98 = local_1060._8_8_;
      uStack_e90 = local_1060._16_8_;
      uStack_e88 = local_1060._24_8_;
      local_10a0 = vpaddw_avx2(local_1080,local_1060);
      local_be0 = *(undefined8 *)*local_fc0;
      uStack_bd8 = *(undefined8 *)(*local_fc0 + 8);
      uStack_bd0 = *(undefined8 *)(*local_fc0 + 0x10);
      uStack_bc8 = *(undefined8 *)(*local_fc0 + 0x18);
      local_bc0 = local_10a0._0_8_;
      uStack_bb8 = local_10a0._8_8_;
      uStack_bb0 = local_10a0._16_8_;
      uStack_ba8 = local_10a0._24_8_;
      local_240 = vpmulhw_avx2(local_10a0,*local_fc0);
      local_244 = local_fc4;
      local_10c0 = vpsllw_avx2(local_240,ZEXT416(local_fc4));
      local_aa0 = *(undefined8 *)*local_fc0;
      uStack_a98 = *(undefined8 *)(*local_fc0 + 8);
      uStack_a90 = *(undefined8 *)(*local_fc0 + 0x10);
      uStack_a88 = *(undefined8 *)(*local_fc0 + 0x18);
      local_a80 = local_10a0._0_8_;
      uStack_a78 = local_10a0._8_8_;
      uStack_a70 = local_10a0._16_8_;
      uStack_a68 = local_10a0._24_8_;
      local_140 = vpmullw_avx2(local_10a0,*local_fc0);
      local_144 = 0x10 - local_fc4;
      local_10e0 = vpsrlw_avx2(local_140,ZEXT416(local_144));
      local_40 = local_10c0._0_8_;
      uStack_38 = local_10c0._8_8_;
      uStack_30 = local_10c0._16_8_;
      uStack_28 = local_10c0._24_8_;
      local_60 = local_10e0._0_8_;
      uStack_58 = local_10e0._8_8_;
      uStack_50 = local_10e0._16_8_;
      uStack_48 = local_10e0._24_8_;
      local_1100 = vpor_avx2(local_10c0,local_10e0);
      local_c20 = *(undefined8 *)*local_fa8;
      uStack_c18 = *(undefined8 *)(*local_fa8 + 8);
      uStack_c10 = *(undefined8 *)(*local_fa8 + 0x10);
      uStack_c08 = *(undefined8 *)(*local_fa8 + 0x18);
      local_c00 = local_1100._0_8_;
      uStack_bf8 = local_1100._8_8_;
      uStack_bf0 = local_1100._16_8_;
      uStack_be8 = local_1100._24_8_;
      local_280 = vpmulhw_avx2(local_1100,*local_fa8);
      local_284 = 0x10 - local_fc4;
      local_1120 = vpsllw_avx2(local_280,ZEXT416(local_284));
      local_ae0 = *(undefined8 *)*local_fa8;
      uStack_ad8 = *(undefined8 *)(*local_fa8 + 8);
      uStack_ad0 = *(undefined8 *)(*local_fa8 + 0x10);
      uStack_ac8 = *(undefined8 *)(*local_fa8 + 0x18);
      local_ac0 = local_1100._0_8_;
      uStack_ab8 = local_1100._8_8_;
      uStack_ab0 = local_1100._16_8_;
      uStack_aa8 = local_1100._24_8_;
      local_180 = vpmullw_avx2(local_1100,*local_fa8);
      local_184 = local_fc4;
      local_1140 = vpsrlw_avx2(local_180,ZEXT416(local_fc4));
      local_80 = local_1120._0_8_;
      uStack_78 = local_1120._8_8_;
      uStack_70 = local_1120._16_8_;
      uStack_68 = local_1120._24_8_;
      local_a0 = local_1140._0_8_;
      uStack_98 = local_1140._8_8_;
      uStack_90 = local_1140._16_8_;
      uStack_88 = local_1140._24_8_;
      local_b00 = vpor_avx2(local_1120,local_1140);
      local_b20 = local_1000._0_8_;
      uStack_b18 = local_1000._8_8_;
      uStack_b10 = local_1000._16_8_;
      uStack_b08 = local_1000._24_8_;
      local_1160 = vpsignw_avx2(local_b00,auVar5);
      local_b40 = local_1100._0_8_;
      uStack_b38 = local_1100._8_8_;
      uStack_b30 = local_1100._16_8_;
      uStack_b28 = local_1100._24_8_;
      local_b60 = local_1000._0_8_;
      uStack_b58 = local_1000._8_8_;
      uStack_b50 = local_1000._16_8_;
      uStack_b48 = local_1000._24_8_;
      local_1180 = vpsignw_avx2(local_1100,auVar5);
      local_f60._8_8_ = SUB328(ZEXT832(0),4);
      local_e20 = local_1100._0_8_;
      uStack_e18 = local_1100._8_8_;
      uStack_e10 = local_1100._16_8_;
      uStack_e08 = local_1100._24_8_;
      local_e40 = 0;
      uStack_e38 = local_f60._8_8_;
      uStack_e30 = 0;
      uStack_e28 = 0;
      local_11a0 = vpcmpgtw_avx2(local_1100,ZEXT832((ulong)local_f60._8_8_) << 0x40);
      coeff_vals_01[1] = (longlong)in_RDX;
      coeff_vals_01[0] = (longlong)in_RCX;
      coeff_vals_01[2] = (longlong)in_RSI;
      coeff_vals_01[3] = (longlong)in_RDI;
      local_f60 = ZEXT832(0) << 0x20;
      store_coefficients_avx2(coeff_vals_01,in_R8);
      coeff_vals_02[1] = (longlong)in_RDX;
      coeff_vals_02[0] = (longlong)in_RCX;
      coeff_vals_02[2] = (longlong)in_RSI;
      coeff_vals_02[3] = (longlong)in_RDI;
      store_coefficients_avx2(coeff_vals_02,in_R8);
      local_f80 = local_11a0._0_8_;
      uStack_f78 = local_11a0._8_8_;
      lStack_f70 = local_11a0._16_8_;
      uStack_f68 = local_11a0._24_8_;
    }
    auVar6 = ZEXT3264(_local_1420);
    v_eobmax_01[1] = local_f80;
    v_eobmax_01[0] = (longlong)plVar11;
    v_eobmax_01[2] = uStack_f78;
    v_eobmax_01[3] = lStack_f70;
    v_mask_00[1] = (longlong)in_RDX;
    v_mask_00[0] = (longlong)in_RCX;
    v_mask_00[2] = (longlong)in_RSI;
    v_mask_00[3] = (longlong)in_RDI;
    get_max_lane_eob(stack0xffffffffffffebf0,v_eobmax_01,v_mask_00);
    _local_1420 = auVar6._0_32_;
  }
  eob256[1] = (longlong)coeff_ptr_00;
  eob256[0] = in_stack_ffffffffffffeb58;
  eob256[2] = (longlong)dequant_ptr_00;
  eob256[3] = (longlong)pauVar10;
  iVar3 = accumulate_eob256(eob256);
  *local_1350 = iVar3;
  return;
}

Assistant:

void aom_quantize_b_32x32_avx2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                               const int16_t *zbin_ptr,
                               const int16_t *round_ptr,
                               const int16_t *quant_ptr,
                               const int16_t *quant_shift_ptr,
                               tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                               const int16_t *dequant_ptr, uint16_t *eob_ptr,
                               const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  quantize_b_no_qmatrix_avx2(coeff_ptr, n_coeffs, zbin_ptr, round_ptr,
                             quant_ptr, quant_shift_ptr, qcoeff_ptr,
                             dqcoeff_ptr, dequant_ptr, eob_ptr, iscan, 1);
}